

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

ArrayPtr<capnp::word> __thiscall
capnp::SchemaLoader::Impl::makeUncheckedNode(Impl *this,Reader node)

{
  size_t in_RCX;
  ArrayPtr<capnp::word> uncheckedBuffer;
  MessageSizeCounts MVar1;
  ArrayPtr<capnp::word> AVar2;
  
  MVar1 = capnp::_::StructReader::totalSize(&node._reader);
  AVar2 = kj::Arena::allocateArray<capnp::word>(&this->arena,MVar1.wordCount + 1);
  uncheckedBuffer.ptr = (word *)AVar2.size_;
  memset((Reader *)AVar2.ptr,0,MVar1.wordCount * 8 + 8);
  uncheckedBuffer.size_ = in_RCX;
  copyToUnchecked<capnp::schema::Node::Reader&>
            ((capnp *)&node._reader,(Reader *)AVar2.ptr,uncheckedBuffer);
  return AVar2;
}

Assistant:

kj::ArrayPtr<word> SchemaLoader::Impl::makeUncheckedNode(schema::Node::Reader node) {
  size_t size = node.totalSize().wordCount + 1;
  kj::ArrayPtr<word> result = arena.allocateArray<word>(size);
  memset(result.begin(), 0, size * sizeof(word));
  copyToUnchecked(node, result);
  return result;
}